

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
TestReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestReaderTestparseWithNoErrorsTestingOffsets *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  Value *pVVar5;
  size_t sVar6;
  Value root;
  Reader reader;
  Value VStack_178;
  string local_150;
  Reader local_130;
  
  Json::Reader::Reader(&local_130);
  Json::Value::Value(&VStack_178,nullValue);
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "{ \"property\" : [\"value\", \"value2\"], \"obj\" : { \"nested\" : 123, \"bool\" : true}, \"null\" : null, \"false\" : false }"
             ,"");
  bVar4 = Json::Reader::parse(&local_130,&local_150,&VStack_178,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (!bVar4) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a6,"ok");
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_150,&local_130);
  sVar3 = local_150._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((pointer)sVar3 != (pointer)0x0) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a7,"reader.getFormattedErrorMessages().size() == 0");
  }
  Json::Reader::getStructuredErrors
            ((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
              *)&local_150,&local_130);
  _Var2._M_p = local_150._M_dataplus._M_p;
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
  ~vector((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *)
          &local_150);
  if ((pointer)local_150._M_string_length != _Var2._M_p) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a8,"reader.getStructuredErrors().size() == 0");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0xf) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a9,"root[\"property\"].getOffsetStart() == 15");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x22) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6aa,"root[\"property\"].getOffsetLimit() == 34");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  pVVar5 = Json::Value::operator[](pVVar5,0);
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x10) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ab,"root[\"property\"][0].getOffsetStart() == 16");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  pVVar5 = Json::Value::operator[](pVVar5,0);
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x17) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ac,"root[\"property\"][0].getOffsetLimit() == 23");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  pVVar5 = Json::Value::operator[](pVVar5,1);
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x19) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ad,"root[\"property\"][1].getOffsetStart() == 25");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"property");
  pVVar5 = Json::Value::operator[](pVVar5,1);
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x21) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ae,"root[\"property\"][1].getOffsetLimit() == 33");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x2c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6af,"root[\"obj\"].getOffsetStart() == 44");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x4c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b0,"root[\"obj\"].getOffsetLimit() == 76");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  pVVar5 = Json::Value::operator[](pVVar5,"nested");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x39) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b1,"root[\"obj\"][\"nested\"].getOffsetStart() == 57");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  pVVar5 = Json::Value::operator[](pVVar5,"nested");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x3c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b2,"root[\"obj\"][\"nested\"].getOffsetLimit() == 60");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  pVVar5 = Json::Value::operator[](pVVar5,"bool");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x47) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b3,"root[\"obj\"][\"bool\"].getOffsetStart() == 71");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"obj");
  pVVar5 = Json::Value::operator[](pVVar5,"bool");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x4b) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b4,"root[\"obj\"][\"bool\"].getOffsetLimit() == 75");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"null");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x57) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b5,"root[\"null\"].getOffsetStart() == 87");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"null");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x5b) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b6,"root[\"null\"].getOffsetLimit() == 91");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"false");
  sVar6 = Json::Value::getOffsetStart(pVVar5);
  if (sVar6 != 0x67) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b7,"root[\"false\"].getOffsetStart() == 103");
  }
  pVVar5 = Json::Value::operator[](&VStack_178,"false");
  sVar6 = Json::Value::getOffsetLimit(pVVar5);
  if (sVar6 != 0x6c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b8,"root[\"false\"].getOffsetLimit() == 108");
  }
  sVar6 = Json::Value::getOffsetStart(&VStack_178);
  if (sVar6 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b9,"root.getOffsetStart() == 0");
  }
  sVar6 = Json::Value::getOffsetLimit(&VStack_178);
  if (sVar6 != 0x6e) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ba,"root.getOffsetLimit() == 110");
  }
  Json::Value::~Value(&VStack_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.commentsBefore_._M_dataplus._M_p != &local_130.commentsBefore_.field_2) {
    operator_delete(local_130.commentsBefore_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.document_._M_dataplus._M_p != &local_130.document_.field_2) {
    operator_delete(local_130.document_._M_dataplus._M_p);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_130.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_130);
  return;
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }",
                         root);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages().size() == 0);
  JSONTEST_ASSERT(reader.getStructuredErrors().size() == 0);
  JSONTEST_ASSERT(root["property"].getOffsetStart() == 15);
  JSONTEST_ASSERT(root["property"].getOffsetLimit() == 34);
  JSONTEST_ASSERT(root["property"][0].getOffsetStart() == 16);
  JSONTEST_ASSERT(root["property"][0].getOffsetLimit() == 23);
  JSONTEST_ASSERT(root["property"][1].getOffsetStart() == 25);
  JSONTEST_ASSERT(root["property"][1].getOffsetLimit() == 33);
  JSONTEST_ASSERT(root["obj"].getOffsetStart() == 44);
  JSONTEST_ASSERT(root["obj"].getOffsetLimit() == 76);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetStart() == 57);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetLimit() == 60);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetStart() == 71);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetLimit() == 75);
  JSONTEST_ASSERT(root["null"].getOffsetStart() == 87);
  JSONTEST_ASSERT(root["null"].getOffsetLimit() == 91);
  JSONTEST_ASSERT(root["false"].getOffsetStart() == 103);
  JSONTEST_ASSERT(root["false"].getOffsetLimit() == 108);
  JSONTEST_ASSERT(root.getOffsetStart() == 0);
  JSONTEST_ASSERT(root.getOffsetLimit() == 110);
}